

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O0

ffs_dstring raw_to_XML_string(FMContext c,FMFormat_conflict format,void *data,int encoded)

{
  int iVar1;
  undefined4 in_ECX;
  FMFormat_conflict in_RDX;
  long in_RSI;
  ffs_dstring ds;
  int index;
  ffs_dstring in_stack_00000100;
  int in_stack_0000010c;
  void *in_stack_00000110;
  void *in_stack_00000118;
  int in_stack_00000124;
  FMFormat_conflict in_stack_00000128;
  FMFormat_conflict in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd0;
  int encoded_00;
  undefined4 in_stack_ffffffffffffffd8;
  undefined8 local_8;
  
  encoded_00 = (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
  iVar1 = FMhas_XML_info(in_stack_ffffffffffffffc8);
  if (iVar1 == 0) {
    local_8 = new_dstring();
    dcatstr(local_8,(char *)in_stack_ffffffffffffffc8);
    dcatstr(local_8,(char *)in_stack_ffffffffffffffc8);
    dcatstr(local_8,(char *)in_stack_ffffffffffffffc8);
    for (iVar1 = 0; iVar1 < *(int *)(in_RSI + 0x44); iVar1 = iVar1 + 1) {
      generic_field_to_XML
                (in_stack_00000128,in_stack_00000124,in_stack_00000118,in_stack_00000110,
                 in_stack_0000010c,in_stack_00000100);
    }
    dcatstr(local_8,(char *)in_stack_ffffffffffffffc8);
    dcatstr(local_8,(char *)in_stack_ffffffffffffffc8);
    dcatstr(local_8,(char *)in_stack_ffffffffffffffc8);
  }
  else {
    local_8 = record_to_XML_string
                        (in_RDX,(void *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),encoded_00);
  }
  return local_8;
}

Assistant:

static ffs_dstring
raw_to_XML_string(FMContext c, FMFormat format, void *data, int encoded)
{
    int index;
    ffs_dstring ds;
    if (FMhas_XML_info(format)) {
	return record_to_XML_string(format, data, encoded);
    }
    ds = new_dstring();
    dcatstr(ds, "<");
    dcatstr(ds, format->format_name);
    dcatstr(ds, ">\n");
    for (index = 0; index < format->field_count; index++) {
	generic_field_to_XML(format, index, data, data, 
			     encoded, ds);
    }
    dcatstr(ds, "</");
    dcatstr(ds, format->format_name);
    dcatstr(ds, ">\n");
    return ds;
}